

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

void __thiscall kwssys::Directory::~Directory(Directory *this)

{
  undefined8 *in_RDI;
  DirectoryInternals *this_00;
  
  this_00 = (DirectoryInternals *)*in_RDI;
  if (this_00 != (DirectoryInternals *)0x0) {
    DirectoryInternals::~DirectoryInternals(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

Directory::~Directory()
{
  delete this->Internal;
}